

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
grow(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *this,
    Entry *oldEntries,size_t *newMemUsed)

{
  uint uVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  Entry *local_28;
  
  local_28 = oldEntries;
  std::
  vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ::push_back(&this->_oldEntries,&local_28);
  uVar1 = this->_numEntries * 2;
  uVar6 = (ulong)uVar1 * 0x10;
  pEVar2 = (Entry *)operator_new__(uVar6);
  if (uVar1 != 0) {
    pEVar3 = pEVar2;
    do {
      (pEVar3->key)._val = -1;
      pEVar3->value = (FaceData *)0x0;
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2 + uVar1);
  }
  *newMemUsed = uVar6;
  for (uVar6 = 0; uVar6 < this->_numEntries; uVar6 = uVar6 + 1) {
    if (local_28[uVar6].value != (FaceData *)0x0) {
      pEVar3 = local_28 + uVar6;
      uVar5 = (pEVar3->key)._val;
      do {
        uVar4 = (uint)uVar5 & uVar1 - 1;
        uVar5 = (ulong)((uint)uVar5 + 1);
      } while (pEVar2[uVar4].value != (FaceData *)0x0);
      pEVar2[uVar4].key._val = (pEVar3->key)._val;
      pEVar2[uVar4].value = pEVar3->value;
    }
  }
  this->_numEntries = uVar1;
  return pEVar2;
}

Assistant:

Entry* grow(Entry* oldEntries, size_t& newMemUsed)
    {
        _oldEntries.push_back(oldEntries);
        uint32_t numNewEntries = _numEntries*2;
        Entry* entries = new Entry[numNewEntries];
        newMemUsed = numNewEntries * sizeof(Entry);
        uint32_t mask = numNewEntries-1;
        for (uint32_t oldIndex = 0; oldIndex < _numEntries; ++oldIndex) {
            Entry& oldEntry = oldEntries[oldIndex];
            if (oldEntry.value) {
                for (int newIndex = oldEntry.key.hash();; ++newIndex) {
                    Entry& newEntry = entries[newIndex&mask];
                    if (!newEntry.value) {
                        newEntry.key.move(oldEntry.key);
                        newEntry.value = oldEntry.value;
                        break;
                    }
                }
            }
        }
        _numEntries = numNewEntries;
        return entries;
    }